

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<unsigned_char,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<unsigned_char,_8UL>::operator=
          (SmallVector<unsigned_char,_8UL> *this,SmallVector<unsigned_char,_8UL> *other)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this != other) {
    (this->super_VectorView<unsigned_char>).buffer_size = 0;
    reserve(this,(other->super_VectorView<unsigned_char>).buffer_size);
    if ((other->super_VectorView<unsigned_char>).buffer_size == 0) {
      uVar2 = 0;
    }
    else {
      uVar1 = 0;
      do {
        (this->super_VectorView<unsigned_char>).ptr[uVar1] =
             (other->super_VectorView<unsigned_char>).ptr[uVar1];
        uVar1 = uVar1 + 1;
        uVar2 = (other->super_VectorView<unsigned_char>).buffer_size;
      } while (uVar1 < uVar2);
    }
    (this->super_VectorView<unsigned_char>).buffer_size = uVar2;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}